

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_lpf_config *
ma_lpf_config_init(ma_format format,ma_uint32 channels,ma_uint32 sampleRate,double cutoffFrequency,
                  ma_uint32 order)

{
  ma_uint32 in_ECX;
  ma_uint32 in_EDX;
  ma_format in_ESI;
  ma_lpf_config *in_RDI;
  uint in_R8D;
  double in_XMM0_Qa;
  ma_uint32 local_44;
  
  if (in_RDI != (ma_lpf_config *)0x0) {
    memset(in_RDI,0,0x20);
  }
  in_RDI->format = in_ESI;
  in_RDI->channels = in_EDX;
  in_RDI->sampleRate = in_ECX;
  in_RDI->cutoffFrequency = in_XMM0_Qa;
  local_44 = in_R8D;
  if (7 < in_R8D) {
    local_44 = 8;
  }
  in_RDI->order = local_44;
  return in_RDI;
}

Assistant:

MA_API ma_lpf_config ma_lpf_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double cutoffFrequency, ma_uint32 order)
{
    ma_lpf_config config;

    MA_ZERO_OBJECT(&config);
    config.format          = format;
    config.channels        = channels;
    config.sampleRate      = sampleRate;
    config.cutoffFrequency = cutoffFrequency;
    config.order           = ma_min(order, MA_MAX_FILTER_ORDER);

    return config;
}